

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial.c
# Opt level: O1

void polynomial_mul(field_t field,polynomial_t l,polynomial_t r,polynomial_t res)

{
  uint uVar1;
  ulong uVar2;
  uint i;
  uint uVar3;
  ulong uVar4;
  byte bVar5;
  uint uVar6;
  
  uVar4 = 0;
  memset(res.coeff,0,(ulong)(res.order + 1));
  do {
    uVar3 = (uint)uVar4;
    if (uVar3 <= res.order) {
      uVar1 = res.order - uVar3;
      if (r.order <= res.order - uVar3) {
        uVar1 = r.order;
      }
      uVar2 = 0;
      do {
        bVar5 = 0;
        if (((ulong)l.coeff[uVar4] != 0) && (bVar5 = 0, r.coeff[uVar2] != 0)) {
          bVar5 = field.exp[(ulong)field.log[r.coeff[uVar2]] + (ulong)field.log[l.coeff[uVar4]]];
        }
        uVar6 = (int)uVar2 + uVar3;
        res.coeff[uVar6] = bVar5 ^ res.coeff[uVar6];
        uVar6 = (int)uVar2 + 1;
        uVar2 = (ulong)uVar6;
      } while (uVar6 <= uVar1);
    }
    uVar4 = (ulong)(uVar3 + 1);
  } while (uVar3 + 1 <= l.order);
  return;
}

Assistant:

void polynomial_mul(field_t field, polynomial_t l, polynomial_t r, polynomial_t res) {
    // perform an element-wise multiplication of two polynomials
    memset(res.coeff, 0, sizeof(field_element_t) * (res.order + 1));
    for (unsigned int i = 0; i <= l.order; i++) {
        if (i > res.order) {
            continue;
        }
        unsigned int j_limit = (r.order > res.order - i) ? res.order - i : r.order;
        for (unsigned int j = 0; j <= j_limit; j++) {
            // e.g. alpha^5*x * alpha^37*x^2 --> alpha^42*x^3
            res.coeff[i + j] = field_add(field, res.coeff[i + j], field_mul(field, l.coeff[i], r.coeff[j]));
        }
    }
}